

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

size_t jessilib::starts_with_length<char,char>
                 (basic_string_view<char,_std::char_traits<char>_> in_string,
                 basic_string_view<char,_std::char_traits<char>_> in_prefix)

{
  char *pcVar1;
  char *pcVar3;
  jessilib *this;
  jessilib *this_00;
  char *pcVar4;
  decode_result dVar5;
  decode_result dVar6;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  char *local_40;
  jessilib *pjVar2;
  
  pcVar4 = in_prefix._M_str;
  pjVar2 = (jessilib *)in_prefix._M_len;
  pcVar3 = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  if (pjVar2 + -1 < this) {
    pcVar1 = (char *)0x0;
    this_00 = pjVar2;
    do {
      in_string_00._M_str = (char *)pjVar2;
      in_string_00._M_len = (size_t)pcVar3;
      dVar5 = decode_codepoint_utf8<char>(this,in_string_00);
      in_string_01._M_str = (char *)dVar5.units;
      in_string_01._M_len = (size_t)pcVar4;
      dVar6 = decode_codepoint_utf8<char>(this_00,in_string_01);
      pjVar2 = (jessilib *)dVar6.units;
      if (in_string_01._M_str == (char *)0x0) {
        return (size_t)(char *)0x0;
      }
      if (pjVar2 == (jessilib *)0x0) {
        return (size_t)(char *)0x0;
      }
      if (dVar5.codepoint != dVar6.codepoint) {
        return (size_t)(char *)0x0;
      }
      this_00 = this_00 + -(long)pjVar2;
      pcVar1 = pcVar1 + (long)in_string_01._M_str;
      this = this + -(long)in_string_01._M_str;
      if (this == (jessilib *)0x0) break;
      pcVar3 = pcVar3 + (long)in_string_01._M_str;
      pcVar4 = pcVar4 + (long)pjVar2;
    } while (this_00 != (jessilib *)0x0);
    local_40 = (char *)0x0;
    if (this_00 == (jessilib *)0x0) {
      local_40 = pcVar1;
    }
  }
  else {
    local_40 = (char *)0x0;
  }
  return (size_t)local_40;
}

Assistant:

size_t starts_with_length(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, compare their sizes and quickly return if in_string is too small
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (string_front.codepoint != prefix_front.codepoint) {
			// Codepoints aren't the same
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}